

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

void ecp_comb_fixed(uchar *x,size_t d,uchar w,mbedtls_mpi *m)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  byte local_39;
  uchar adjust;
  uchar cc;
  ulong uStack_38;
  uchar c;
  size_t j;
  size_t i;
  mbedtls_mpi *m_local;
  uchar w_local;
  size_t d_local;
  uchar *x_local;
  
  memset(x,0,d + 1);
  for (j = 0; j < d; j = j + 1) {
    for (uStack_38 = 0; uStack_38 < w; uStack_38 = uStack_38 + 1) {
      iVar3 = mbedtls_mpi_get_bit(m,j + d * uStack_38);
      x[j] = x[j] | (byte)(iVar3 << ((byte)uStack_38 & 0x1f));
    }
  }
  local_39 = 0;
  for (j = 1; j <= d; j = j + 1) {
    bVar1 = x[j];
    x[j] = x[j] ^ local_39;
    cVar2 = '\x01' - (x[j] & 1);
    local_39 = bVar1 & local_39 | x[j] & x[j - 1] * cVar2;
    x[j] = x[j] ^ x[j - 1] * cVar2;
    x[j - 1] = x[j - 1] | cVar2 * -0x80;
  }
  return;
}

Assistant:

static void ecp_comb_fixed( unsigned char x[], size_t d,
                            unsigned char w, const mbedtls_mpi *m )
{
    size_t i, j;
    unsigned char c, cc, adjust;

    memset( x, 0, d+1 );

    /* First get the classical comb values (except for x_d = 0) */
    for( i = 0; i < d; i++ )
        for( j = 0; j < w; j++ )
            x[i] |= mbedtls_mpi_get_bit( m, i + d * j ) << j;

    /* Now make sure x_1 .. x_d are odd */
    c = 0;
    for( i = 1; i <= d; i++ )
    {
        /* Add carry and update it */
        cc   = x[i] & c;
        x[i] = x[i] ^ c;
        c = cc;

        /* Adjust if needed, avoiding branches */
        adjust = 1 - ( x[i] & 0x01 );
        c   |= x[i] & ( x[i-1] * adjust );
        x[i] = x[i] ^ ( x[i-1] * adjust );
        x[i-1] |= adjust << 7;
    }
}